

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_data_source__on_read
                    (ma_data_source *pDataSource,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  uint sizeInFrames;
  ma_result mVar1;
  ulong uVar2;
  long lVar3;
  size_t __n;
  int __c;
  void *__dest;
  ulong uVar4;
  ma_uint64 mVar5;
  long lVar6;
  bool bVar7;
  ma_uint32 mappedFrameCount;
  void *pMappedBuffer;
  uint local_4c;
  void *local_48;
  ma_uint64 *local_40;
  void *local_38;
  
  mVar5 = 0;
  local_48 = pFramesOut;
  local_40 = pFramesRead;
  do {
    uVar2 = frameCount - mVar5;
    if (frameCount < mVar5 || uVar2 == 0) break;
    if (0xfffffffe < uVar2) {
      uVar2 = 0xffffffff;
    }
    local_4c = (uint)uVar2;
    mVar1 = ma_pcm_rb_acquire_read((ma_pcm_rb *)pDataSource,&local_4c,&local_38);
    sizeInFrames = local_4c;
    if (local_4c == 0 || mVar1 != MA_SUCCESS) {
      bVar7 = false;
    }
    else {
      uVar4 = (ulong)local_4c;
      uVar2 = (ulong)(uint)((&DAT_0017d490)[*(uint *)((long)pDataSource + 0x88)] *
                           *(int *)((long)pDataSource + 0x8c));
      __dest = (void *)(mVar5 * uVar2 + (long)local_48);
      if (__dest != local_38) {
        memcpy(__dest,local_38,uVar2 * uVar4);
      }
      mVar1 = ma_pcm_rb_commit_read((ma_pcm_rb *)pDataSource,sizeInFrames);
      bVar7 = mVar1 == MA_SUCCESS;
      if (!bVar7) {
        uVar4 = 0;
      }
      mVar5 = mVar5 + uVar4;
    }
  } while (bVar7);
  lVar3 = frameCount - mVar5;
  if (mVar5 <= frameCount && lVar3 != 0) {
    uVar2 = (ulong)((&DAT_0017d490)[*(uint *)((long)pDataSource + 0x88)] *
                   *(uint *)((long)pDataSource + 0x8c));
    lVar6 = mVar5 * uVar2;
    mVar5 = frameCount;
    if ((ulong)*(uint *)((long)pDataSource + 0x88) == 1) {
      __n = lVar3 * (ulong)*(uint *)((long)pDataSource + 0x8c);
      if (__n == 0) goto LAB_00162e7e;
      __c = 0x80;
    }
    else {
      if ((local_48 == (void *)0x0) || (__n = lVar3 * uVar2, __n == 0)) goto LAB_00162e7e;
      __c = 0;
    }
    memset((void *)(lVar6 + (long)local_48),__c,__n);
  }
LAB_00162e7e:
  *local_40 = mVar5;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_pcm_rb_data_source__on_read(ma_data_source* pDataSource, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    /* Since there's no notion of an end, we don't ever want to return MA_AT_END here. But it is possible to return 0. */
    ma_pcm_rb* pRB = (ma_pcm_rb*)pDataSource;
    ma_result result;
    ma_uint64 totalFramesRead;

    MA_ASSERT(pRB != NULL);

    /* We need to run this in a loop since the ring buffer itself may loop. */
    totalFramesRead = 0;
    while (totalFramesRead < frameCount) {
        void* pMappedBuffer;
        ma_uint32 mappedFrameCount;
        ma_uint64 framesToRead = frameCount - totalFramesRead;
        if (framesToRead > 0xFFFFFFFF) {
            framesToRead = 0xFFFFFFFF;
        }

        mappedFrameCount = (ma_uint32)framesToRead;
        result = ma_pcm_rb_acquire_read(pRB, &mappedFrameCount, &pMappedBuffer);
        if (result != MA_SUCCESS) {
            break;
        }

        if (mappedFrameCount == 0) {
            break;  /* <-- End of ring buffer. */
        }

        ma_copy_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), pMappedBuffer, mappedFrameCount, pRB->format, pRB->channels);

        result = ma_pcm_rb_commit_read(pRB, mappedFrameCount);
        if (result != MA_SUCCESS) {
            break;
        }

        totalFramesRead += mappedFrameCount;
    }

    /*
    There is no notion of an "end" in a ring buffer. If we didn't have enough data to fill the requested frame
    count we'll need to pad with silence. If we don't do this, totalFramesRead might equal 0 which will result
    in the data source layer at a higher level translating this to MA_AT_END which is incorrect for a ring buffer.
    */
    if (totalFramesRead < frameCount) {
        ma_silence_pcm_frames(ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, pRB->format, pRB->channels), (frameCount - totalFramesRead), pRB->format, pRB->channels);
        totalFramesRead = frameCount;
    }

    *pFramesRead = totalFramesRead;
    return MA_SUCCESS;
}